

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LRNParameter::SharedCtor(LRNParameter *this)

{
  LRNParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->norm_region_,0,8);
  this->local_size_ = 5;
  this->alpha_ = 1.0;
  this->beta_ = 0.75;
  this->k_ = 1.0;
  return;
}

Assistant:

void LRNParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&norm_region_, 0, reinterpret_cast<char*>(&engine_) -
    reinterpret_cast<char*>(&norm_region_) + sizeof(engine_));
  local_size_ = 5u;
  alpha_ = 1;
  beta_ = 0.75f;
  k_ = 1;
}